

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_find_string_in_file(char *filename,char *string,int stringlen)

{
  int __fd;
  ssize_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char buf [128];
  char local_a8 [128];
  
  iVar3 = 0;
  __fd = lws_open(filename,0);
  if (__fd < 0) {
    uVar4 = 0;
    _lws_log(1,"can\'t open auth file: %s\n",filename);
  }
  else {
    iVar2 = 0;
    sVar1 = 0;
    while( true ) {
      if (iVar2 == (int)sVar1) {
        sVar1 = read(__fd,local_a8,0x80);
        iVar2 = 0;
        if ((int)sVar1 < 1) {
          uVar4 = (uint)(iVar3 == stringlen);
          goto LAB_00131c5e;
        }
      }
      if ((iVar3 == stringlen) &&
         ((local_a8[iVar2] == '\n' || (iVar3 = 0, local_a8[iVar2] == '\r')))) break;
      if (local_a8[iVar2] == string[iVar3]) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar3 = 0;
      }
      iVar2 = iVar2 + 1;
    }
    uVar4 = 1;
LAB_00131c5e:
    close(__fd);
  }
  return uVar4;
}

Assistant:

static int
lws_find_string_in_file(const char *filename, const char *string, int stringlen)
{
	char buf[128];
	int fd, match = 0, pos = 0, n = 0, hit = 0;

	fd = lws_open(filename, O_RDONLY);
	if (fd < 0) {
		lwsl_err("can't open auth file: %s\n", filename);
		return 0;
	}

	while (1) {
		if (pos == n) {
			n = (int)read(fd, buf, sizeof(buf));
			if (n <= 0) {
				if (match == stringlen)
					hit = 1;
				break;
			}
			pos = 0;
		}

		if (match == stringlen) {
			if (buf[pos] == '\r' || buf[pos] == '\n') {
				hit = 1;
				break;
			}
			match = 0;
		}

		if (buf[pos] == string[match])
			match++;
		else
			match = 0;

		pos++;
	}

	close(fd);

	return hit;
}